

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O1

int TIFFWriteDirectoryTagShortPerSample
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint16_t value)

{
  int iVar1;
  uint16_t *value_00;
  long lVar2;
  ushort uVar3;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    iVar1 = 1;
  }
  else {
    value_00 = (uint16_t *)_TIFFmallocExt(tif,(ulong)((uint)(tif->tif_dir).td_samplesperpixel * 2));
    if (value_00 == (uint16_t *)0x0) {
      iVar1 = 0;
      TIFFErrorExtR(tif,"TIFFWriteDirectoryTagShortPerSample","Out of memory");
    }
    else {
      uVar3 = (tif->tif_dir).td_samplesperpixel;
      if (uVar3 != 0) {
        lVar2 = 0;
        do {
          value_00[lVar2] = value;
          uVar3 = (tif->tif_dir).td_samplesperpixel;
          lVar2 = lVar2 + 1;
        } while ((ushort)lVar2 < uVar3);
      }
      iVar1 = TIFFWriteDirectoryTagCheckedShortArray(tif,ndir,dir,tag,(uint)uVar3,value_00);
      _TIFFfreeExt(tif,value_00);
    }
  }
  return iVar1;
}

Assistant:

static int TIFFWriteDirectoryTagShortPerSample(TIFF *tif, uint32_t *ndir,
                                               TIFFDirEntry *dir, uint16_t tag,
                                               uint16_t value)
{
    static const char module[] = "TIFFWriteDirectoryTagShortPerSample";
    uint16_t *m;
    uint16_t *na;
    uint16_t nb;
    int o;
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    m = _TIFFmallocExt(tif, tif->tif_dir.td_samplesperpixel * sizeof(uint16_t));
    if (m == NULL)
    {
        TIFFErrorExtR(tif, module, "Out of memory");
        return (0);
    }
    for (na = m, nb = 0; nb < tif->tif_dir.td_samplesperpixel; na++, nb++)
        *na = value;
    o = TIFFWriteDirectoryTagCheckedShortArray(
        tif, ndir, dir, tag, tif->tif_dir.td_samplesperpixel, m);
    _TIFFfreeExt(tif, m);
    return (o);
}